

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  PointerReader reader_00;
  PointerReader reader_01;
  PointerBuilder builder;
  ReaderFor<bool> RVar1;
  int iVar2;
  int32_t iVar3;
  char *__s1;
  long in_RSI;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar4;
  Promise<void> PVar5;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Reader params;
  Fault f;
  ArrayPtr<const_char> local_258;
  Runnable local_248;
  SegmentBuilder *in_stack_fffffffffffffdc0;
  CapTableBuilder *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd0 [16];
  WirePointer *in_stack_fffffffffffffde0;
  ReaderFor<DynamicStruct> local_218;
  Reader local_1e0;
  uint local_1a8 [6];
  Maybe<kj::Exception> local_190;
  
  if (method.proto._reader.pointerCount == 0) {
    method.proto._reader.nestingLimit = 0x7fffffff;
    method.proto._reader.capTable = (CapTableReader *)0x0;
    method.proto._reader.pointers = (WirePointer *)0x0;
    method.proto._reader.segment = (SegmentReader *)0x0;
  }
  local_190.ptr._0_8_ = method.proto._reader.segment;
  local_190.ptr.field_1.value.ownFile.content.ptr = (char *)method.proto._reader.capTable;
  local_190.ptr.field_1.value.ownFile.content.size_ = (size_t)method.proto._reader.pointers;
  local_190.ptr.field_1._16_4_ = method.proto._reader.nestingLimit;
  local_258 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&local_190,(void *)0x0,0);
  __s1 = local_258.ptr;
  if (local_258.size_ == 4) {
    iVar2 = bcmp(__s1,"foo",3);
    if (iVar2 == 0) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      (**(context.hook)->_vptr_CallContextHook)(&local_190);
      reader_00.capTable = &in_stack_fffffffffffffdc8->super_CapTableReader;
      reader_00.segment = &in_stack_fffffffffffffdc0->super_SegmentReader;
      reader_00.pointer = (WirePointer *)in_stack_fffffffffffffdd0._0_8_;
      reader_00.nestingLimit = in_stack_fffffffffffffdd0._8_4_;
      reader_00._28_4_ = in_stack_fffffffffffffdd0._12_4_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_00,(StructSchema)local_190.ptr.field_1.value.ownFile.content.ptr);
      name.content.size_ = 2;
      name.content.ptr = "i";
      DynamicStruct::Reader::get((Reader *)&local_190,&local_1e0,name);
      iVar3 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_190);
      DynamicValue::Reader::~Reader((Reader *)&local_190);
      if ((iVar3 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
        local_248._vptr_Runnable._0_4_ = 0x7b;
        name_00.content.size_ = 2;
        name_00.content.ptr = "i";
        DynamicStruct::Reader::get((Reader *)&local_190,&local_1e0,name_00);
        local_1a8[0] = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_190);
        kj::_::Debug::log<char_const(&)[54],int,int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,400,ERROR,
                   "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", 123, params.get(\"i\").as<int>()"
                   ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                   (int *)&local_248,(int *)local_1a8);
        DynamicValue::Reader::~Reader((Reader *)&local_190);
      }
      name_01.content.size_ = 2;
      name_01.content.ptr = "j";
      DynamicStruct::Reader::get((Reader *)&local_190,&local_1e0,name_01);
      RVar1 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_190);
      DynamicValue::Reader::~Reader((Reader *)&local_190);
      if (!RVar1 && kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x191,ERROR,"\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\"",
                   (char (*) [44])"failed: expected params.get(\"j\").as<bool>()");
      }
      local_1a8[0] = local_1a8[0] & 0xffffff00;
      (*(context.hook)->_vptr_CallContextHook[2])(&local_190);
      builder.pointer = in_stack_fffffffffffffde0;
      builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdd0._0_8_;
      builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdd0._8_8_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (builder,(StructSchema)local_190.ptr.field_1.value.ownFile.content.ptr);
      local_190.ptr._0_4_ = 6;
      local_190.ptr.field_1.value.ownFile.content.ptr = "foo";
      local_190.ptr.field_1.value.ownFile.content.size_ = 4;
      name_03.content.size_ = 2;
      name_03.content.ptr = "x";
      DynamicStruct::Builder::set((Builder *)&local_248,name_03,(Reader *)&local_190);
      DynamicValue::Reader::~Reader((Reader *)&local_190);
      goto LAB_0028ada9;
    }
    iVar2 = bcmp(__s1,"baz",3);
    if (iVar2 == 0) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      (**(context.hook)->_vptr_CallContextHook)(&local_190);
      reader_01.capTable = &in_stack_fffffffffffffdc8->super_CapTableReader;
      reader_01.segment = &in_stack_fffffffffffffdc0->super_SegmentReader;
      reader_01.pointer = (WirePointer *)in_stack_fffffffffffffdd0._0_8_;
      reader_01.nestingLimit = in_stack_fffffffffffffdd0._8_4_;
      reader_01._28_4_ = in_stack_fffffffffffffdd0._12_4_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_01,(StructSchema)local_190.ptr.field_1.value.ownFile.content.ptr);
      name_02.content.size_ = 2;
      name_02.content.ptr = "s";
      DynamicStruct::Reader::get((Reader *)&local_190,&local_1e0,name_02);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_218,(Reader *)&local_190);
      reader.reader.segment = local_218.reader.segment;
      reader.schema.super_Schema.raw = local_218.schema.super_Schema.raw;
      reader.reader.capTable = local_218.reader.capTable;
      reader.reader.data = local_218.reader.data;
      reader.reader.pointers = local_218.reader.pointers;
      reader.reader.dataSize = local_218.reader.dataSize;
      reader.reader.pointerCount = local_218.reader.pointerCount;
      reader.reader._38_2_ = local_218.reader._38_2_;
      reader.reader.nestingLimit = local_218.reader.nestingLimit;
      reader.reader._44_4_ = local_218.reader._44_4_;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader((Reader *)&local_190);
      (*(context.hook)->_vptr_CallContextHook[1])();
      local_248._vptr_Runnable = (_func_int **)&PTR_run_0062be68;
      kj::_::runCatchingExceptions(&local_190,&local_248);
      if ((Void)local_190.ptr.isSet == (Void)0x1) {
        kj::Exception::~Exception(&local_190.ptr.field_1.value);
      }
      else if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[88]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x199,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
                   ,(char (*) [88])
                    "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
                  );
      }
      goto LAB_0028ada9;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
            ((Fault *)&local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x19c,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
             (char (*) [23])"Method not implemented",(Reader *)&local_258);
  kj::_::Debug::Fault::~Fault((Fault *)&local_190);
LAB_0028ada9:
  OVar4 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_190);
  PVar5.super_PromiseBase.node.ptr = OVar4.ptr;
  (this->super_Server).super_Server._vptr_Server = (_func_int **)local_190.ptr._0_8_;
  (this->super_Server).super_Server.thisHook =
       (ClientHook *)local_190.ptr.field_1.value.ownFile.content.ptr;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }